

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QByteArray * qt_convert_to_local_8bit(QStringView string)

{
  QStringView in;
  bool bVar1;
  DecodedData<QStringView> *in_RDI;
  long in_FS_OFFSET;
  QStringEncoder fromUtf16;
  DecodedData<QStringView> *this;
  undefined4 uVar2;
  QFlagsStorage<QStringConverter::Flag> flags;
  QStringView local_50;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = SUB84(in_RDI,0);
  flags.i = (Int)((ulong)in_RDI >> 0x20);
  this = in_RDI;
  bVar1 = QStringView::isNull(&local_50);
  if (bVar1) {
    QByteArray::QByteArray((QByteArray *)0x156aec);
  }
  else {
    memset(local_40,0xaa,0x38);
    QFlags<QStringConverter::Flag>::QFlags
              ((QFlags<QStringConverter::Flag> *)this,(Flag)((ulong)in_RDI >> 0x20));
    QStringEncoder::QStringEncoder
              ((QStringEncoder *)this,(Encoding)((ulong)in_RDI >> 0x20),(Flags)flags.i);
    in.m_size._0_4_ = uVar2;
    in.m_data = (storage_type_conflict *)this;
    in.m_size._4_4_ =
         (QFlagsStorage<QStringConverter::Flag>)(QFlagsStorage<QStringConverter::Flag>)flags.i;
    QStringEncoder::operator()((QStringEncoder *)in_RDI,in);
    QStringEncoder::DecodedData::operator_cast_to_QByteArray(this);
    QStringEncoder::~QStringEncoder((QStringEncoder *)0x156b69);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)this;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qt_convert_to_local_8bit(QStringView string)
{
    if (string.isNull())
        return QByteArray();
    QStringEncoder fromUtf16(QStringEncoder::System, QStringEncoder::Flag::Stateless);
    return fromUtf16(string);
}